

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,3>,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar7;
  double dVar8;
  undefined7 uVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *pVVar10;
  PrecisionCase *pPVar11;
  FloatFormat *fmt;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  ContextType type;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  char *pcVar17;
  size_t sVar18;
  long *plVar19;
  ShaderExecutor *pSVar20;
  long lVar21;
  IVal *pIVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  TestError *this_00;
  uint uVar25;
  TestLog *pTVar26;
  undefined1 *puVar27;
  Vector<float,_3> *val;
  Interval *__return_storage_ptr__;
  float *value;
  long lVar28;
  byte bVar29;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_558 [8];
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *local_550;
  pointer local_548;
  undefined1 local_540 [12];
  undefined4 uStack_534;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  PrecisionCase *local_520;
  size_t local_518;
  Statement *local_510;
  ulong local_508;
  long local_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [56];
  string local_4b0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_490;
  ResultCollector *local_488;
  undefined1 local_480 [16];
  _Base_ptr local_470;
  _Rb_tree_node_base *local_468;
  _Rb_tree_node_base *local_460;
  double local_458;
  undefined1 local_438 [8];
  undefined1 auStack_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  pointer local_290;
  FloatFormat *local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar29 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_518 = ((long)pVVar4 - (long)pVVar3 >> 2) * -0x5555555555555555;
  local_550 = variables;
  local_510 = stmt;
  local_490 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  ::Outputs(&local_250,local_518);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Statement: ",0xb);
  (*local_510->_vptr_Statement[2])(local_510,(ostringstream *)auStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_480 + 8);
  local_480._8_4_ = _S_red;
  local_470 = (_Base_ptr)0x0;
  local_458 = 0.0;
  local_548 = pVVar3;
  local_468 = p_Var2;
  local_460 = p_Var2;
  (*local_510->_vptr_Statement[4])(local_510,local_480);
  if (local_468 != p_Var2) {
    p_Var16 = local_468;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var2);
  }
  if (local_458 != 0.0) {
    local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
      operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_480);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar17 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar17 == (char *)0x0) {
    std::ios::clear((int)(auStack_558 + (long)((TestLog *)((long)local_438 + -0x18))->m_log) + 0x120
                   );
  }
  else {
    sVar18 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar17,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar19 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar26 = (TestLog *)(plVar19 + 2);
    if ((TestLog *)*plVar19 == pTVar26) {
      local_428._M_allocated_capacity = (size_type)pTVar26->m_log;
      local_428._8_8_ = plVar19[3];
      local_438 = (undefined1  [8])(auStack_430 + 8);
    }
    else {
      local_428._M_allocated_capacity = (size_type)pTVar26->m_log;
      local_438 = (undefined1  [8])*plVar19;
    }
    auStack_430 = (undefined1  [8])plVar19[1];
    *plVar19 = (long)pTVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,this,
             (local_550->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,this,
             (local_550->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)local_438,this,
             (local_550->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_510->_vptr_Statement[2])(local_510,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar20 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_438 = (undefined1  [8])
              (local_490->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_430 = (undefined1  [8])
                (local_490->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_490->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_490->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar20->_vptr_ShaderExecutor[3])
            (pSVar20,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar15 = (*pSVar20->_vptr_ShaderExecutor[2])(pSVar20);
  if ((char)iVar15 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar20->_vptr_ShaderExecutor[5])(pSVar20);
  (*pSVar20->_vptr_ShaderExecutor[6])(pSVar20,local_518,local_438,local_1a8);
  local_288 = &(this->m_ctx).floatFormat;
  local_520 = this;
  (*pSVar20->_vptr_ShaderExecutor[1])(pSVar20);
  lVar21 = 0x10;
  do {
    local_1b8._M_local_buf[lVar21] = '\0';
    *(undefined8 *)(local_1a8 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x58);
  lVar21 = 0x10;
  do {
    local_1b8._M_local_buf[lVar21] = '\0';
    *(undefined8 *)(local_1a8 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x58);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_438);
  pVVar10 = local_550;
  lVar21 = 0x10;
  do {
    *(undefined1 *)((long)&local_490 + lVar21) = 0;
    *(undefined8 *)(local_480 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_480 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x58);
  lVar21 = 0x10;
  do {
    *(undefined1 *)((long)&local_490 + lVar21) = 0;
    *(undefined8 *)(local_480 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_480 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x58);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_280,
             (local_550->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar10->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_4f8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar10->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_540);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar10->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(local_4e8 + 0x38));
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_280,
             (pVVar10->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr,(IVal *)local_438);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_280,
             (pVVar10->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_480);
  if (pVVar4 == local_548) {
    local_508 = 0;
  }
  else {
    local_488 = &local_520->m_status;
    local_290 = (pointer)(local_518 + (local_518 == 0));
    local_548 = (pointer)0x0;
    local_508 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      lVar21 = 0x10;
      do {
        *(undefined1 *)((long)&local_490 + lVar21) = 0;
        *(undefined8 *)(local_480 + lVar21 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_480 + lVar21) = 0xfff0000000000000;
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x58);
      lVar21 = 0x10;
      do {
        *(undefined1 *)((long)&local_490 + lVar21) = 0;
        *(undefined8 *)(local_480 + lVar21 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_480 + lVar21) = 0xfff0000000000000;
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x58);
      if (((ulong)local_548 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_520->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_288;
      pVVar3 = (local_490->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_500 = (long)local_548 * 3;
      local_540._8_4_ = pVVar3[(long)local_548].m_data[2];
      local_540._0_8_ = *(undefined8 *)pVVar3[(long)local_548].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_4f8,local_288,(Vector<float,_3> *)local_540);
      pVVar10 = local_550;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_4f8);
      pIVar22 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_280,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pIVar23 = (IVal *)local_438;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        uVar9 = *(undefined7 *)&pIVar23->m_data[0].field_0x1;
        pIVar22->m_data[0].m_hasNaN = pIVar23->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar22->m_data[0].field_0x1 = uVar9;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar29 * -2 + 1) * 8);
        pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar10->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_410.basic.type = (local_520->m_ctx).precision;
      local_418 = fmt->m_maxValue;
      local_438 = *(undefined1 (*) [8])fmt;
      auStack_430 = *(undefined1 (*) [8])&fmt->m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_428._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_400 = 0;
      local_410._8_8_ = &local_280;
      (*local_510->_vptr_Statement[3])(local_510,(IVal *)local_438);
      pIVar23 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_280,
                           (pVVar10->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar23);
      pIVar23 = (IVal *)local_438;
      pIVar22 = (IVal *)local_480;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        uVar9 = *(undefined7 *)&pIVar23->m_data[0].field_0x1;
        pIVar22->m_data[0].m_hasNaN = pIVar23->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar22->m_data[0].field_0x1 = uVar9;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar29 * -2 + 1) * 8);
        pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      value = (local_250.out1.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + local_500;
      local_500 = local_500 * 4;
      bVar13 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_480,(Vector<float,_3> *)value);
      local_438 = (undefined1  [8])(auStack_430 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_488,bVar13,(string *)local_438);
      pVVar10 = local_550;
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      pIVar24 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_280,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_438;
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)__return_storage_ptr__,&local_2b8,pIVar24);
      pVVar3 = local_548;
      puVar27 = local_1a8;
      lVar21 = 0;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar28 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar28);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar28;
          dVar8 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar27 + lVar28) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar27 + lVar28) + 8) = dVar8;
          lVar28 = lVar28 + 0x48;
        } while (lVar28 != 0xd8);
        lVar21 = lVar21 + 1;
        puVar27 = puVar27 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar21 != 3);
      bVar14 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_548);
      local_438 = (undefined1  [8])(auStack_430 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(local_488,bVar14,(string *)local_438);
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      uVar25 = (int)local_508 + ((byte)~(bVar13 && bVar14) & 1);
      local_508 = (ulong)uVar25;
      if ((int)uVar25 < 0x65 && (!bVar13 || !bVar14)) {
        local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
        pcVar17 = "Failed";
        if (bVar13 && bVar14) {
          pcVar17 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,pcVar17,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar5 = (local_550->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        val = (Vector<float,_3> *)local_4e8;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)((local_490->in0).
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_500),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_540._0_8_,
                   CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_4f8._0_8_ != (Vector<float,_3> *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar7 = (local_550->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                 .m_ptr;
        pIVar24 = (IVal *)local_4e8;
        pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = pIVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Matrix<float,3,3>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   (local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar3),
                   (Matrix<float,_3,_3> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_540._0_8_,
                   CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,3>>
                  ((string *)(local_4e8 + 0x38),(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)local_1a8,pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar5 = (local_550->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pIVar23 = (IVal *)local_4e8;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_250.out1.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_500),
                   (Vector<float,_3> *)pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_540._0_8_,
                   CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  ((string *)(local_4e8 + 0x38),(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)local_480,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
        std::ios_base::~ios_base(local_3c0);
      }
      local_548 = (pointer)((long)local_548->m_data + 1);
    } while (local_548 != local_290);
  }
  pPVar11 = local_520;
  iVar15 = (int)local_508;
  if (100 < iVar15) {
    local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar15 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  if (iVar15 == 0) {
    local_438 = (undefined1  [8])((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_438 = (undefined1  [8])((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}